

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_ACS_ExecuteWithResult
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  undefined7 in_register_00000011;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_10 = arg3;
  local_c = arg4;
  local_18 = arg1;
  local_14 = arg2;
  iVar1 = P_StartScript(it,ln,arg0,level.MapName.Chars,&local_18,4,
                        (uint)CONCAT71(in_register_00000011,backSide) | 6);
  return iVar1;
}

Assistant:

FUNC(LS_ACS_ExecuteWithResult)
// ACS_ExecuteWithResult (script, s_arg1, s_arg2, s_arg3, s_arg4)
{
	// This is like ACS_ExecuteAlways, except the script is always run on
	// the current map, and the return value is whatever the script sets
	// with SetResultValue.
	int args[4] = { arg1, arg2, arg3, arg4 };
	int flags = (backSide ? ACS_BACKSIDE : 0) | ACS_ALWAYS | ACS_WANTRESULT;

	return P_StartScript (it, ln, arg0, level.MapName, args, 4, flags);
}